

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTWeather.cpp
# Opt level: O0

void __thiscall LTWeather::Set(LTWeather *this)

{
  bool bVar1;
  uint uVar2;
  long in_RDI;
  array<float,_13UL> *in_stack_00000008;
  XDR_farr<13UL> *in_stack_00000010;
  string *in_stack_00000628;
  LTWeather *in_stack_00000630;
  undefined8 in_stack_ffffffffffffffa8;
  float v;
  DataRefs *in_stack_ffffffffffffffb0;
  allocator<char> local_29;
  string local_28 [8];
  allocator<char> *in_stack_ffffffffffffffe0;
  array<float,_3UL> *in_stack_ffffffffffffffe8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffff0;
  
  v = (float)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  XDR_int::set((XDR_int *)in_stack_ffffffffffffffb0,(int)v);
  XDR_int::set((XDR_int *)in_stack_ffffffffffffffb0,(int)v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  uVar2 = std::isnan((double)(ulong)*(uint *)(in_RDI + 0x58));
  if ((uVar2 & 1) == 0) {
    XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  }
  else {
    XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  }
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<13UL>::set(in_stack_00000010,in_stack_00000008);
  XDR_farr<3UL>::set((XDR_farr<3UL> *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  XDR_farr<3UL>::set((XDR_farr<3UL> *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  XDR_farr<3UL>::set((XDR_farr<3UL> *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  XDR_farr<3UL>::set((XDR_farr<3UL> *)in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  XDR_float::set((XDR_float *)in_stack_ffffffffffffffb0,v);
  bVar1 = DataRefs::ShallLogWeather(in_stack_ffffffffffffffb0);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffff0,(char *)in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0
              );
    Log(in_stack_00000630,in_stack_00000628);
    std::__cxx11::string::~string(local_28);
    std::allocator<char>::~allocator(&local_29);
  }
  return;
}

Assistant:

void LTWeather::Set () const
{
    wdr_update_immediately.set(update_immediately);

    wdr_change_mode.set(WDR_CM_STATIC);             // 3 - Static (this also switches off XP's real weather)

    wdr_visibility_reported_sm.set(visibility_reported_sm);
    wdr_sealevel_temperature_c.set(sealevel_temperature_c);
    wdr_qnh_base_elevation.set(qnh_base_elevation);
    if (!std::isnan(qnh_pas))                       // prefer QNH as it is typically as reported by METAR
        wdr_qnh_pas.set(qnh_pas);
    else
        wdr_sealevel_pressure_pas.set(sealevel_pressure_pas);
    wdr_rain_percent.set(rain_percent);
    wdr_wind_altitude_msl_m.set(wind_altitude_msl_m);
    wdr_wind_speed_msc.set(wind_speed_msc);
    wdr_wind_direction_degt.set(wind_direction_degt);
    wdr_shear_speed_msc.set(shear_speed_msc);
    wdr_shear_direction_degt.set(shear_direction_degt);
    wdr_turbulence.set(turbulence);
    wdr_dewpoint_deg_c.set(dewpoint_deg_c);
    wdr_temperature_altitude_msl_m.set(temperature_altitude_msl_m);
    wdr_temperatures_aloft_deg_c.set(temperatures_aloft_deg_c);
    wdr_cloud_type.set(cloud_type);
    wdr_cloud_coverage_percent.set(cloud_coverage_percent);
    wdr_cloud_base_msl_m.set(cloud_base_msl_m);
    wdr_cloud_tops_msl_m.set(cloud_tops_msl_m);
    wdr_tropo_temp_c.set(tropo_temp_c);
    wdr_tropo_alt_m.set(tropo_alt_m);
    wdr_thermal_rate_ms.set(thermal_rate_ms);
    wdr_wave_amplitude.set(wave_amplitude);
    wdr_wave_dir.set(wave_dir);
    wdr_runway_friction.set(float(runway_friction));
    wdr_variability_pct.set(variability_pct);

    if (dataRefs.ShallLogWeather())
        Log(update_immediately ? "Set Weather immediately" : "Set Weather");
}